

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O3

Point * __thiscall p2t::Triangle::PointCW(Triangle *this,Point *point)

{
  Point *pPVar1;
  
  if (this->points_[0] == point) {
    return this->points_[2];
  }
  pPVar1 = this->points_[0];
  if ((this->points_[1] != point) && (pPVar1 = this->points_[1], this->points_[2] != point)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                  ,0xde,"Point *p2t::Triangle::PointCW(const Point &)");
  }
  return pPVar1;
}

Assistant:

Point* Triangle::PointCW(const Point& point)
{
  if (&point == points_[0]) {
    return points_[2];
  } else if (&point == points_[1]) {
    return points_[0];
  } else if (&point == points_[2]) {
    return points_[1];
  }
  assert(0);
  return NULL;
}